

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_scanPi(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char **ppcVar1;
  byte bVar2;
  undefined8 uVar3;
  int iVar4;
  undefined8 in_RAX;
  char **ppcVar5;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *pcVar6;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *target;
  unsigned_short *in_R8;
  long lVar7;
  char **ptr_00;
  int tok;
  undefined8 uStack_38;
  
  if (ptr == end) {
    return -1;
  }
  bVar2 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uStack_38 = in_RAX;
  if (bVar2 < 0x16) {
    if (bVar2 == 5) {
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
      iVar4 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
      lVar7 = 2;
      pcVar6 = extraout_RDX_00;
    }
    else if (bVar2 == 6) {
      if ((long)(end + -(long)ptr) < 3) {
        return -2;
      }
      iVar4 = (*enc[3].scanners[0])(enc,ptr,end,(char **)(end + -(long)ptr));
      lVar7 = 3;
      pcVar6 = extraout_RDX_01;
    }
    else {
      if (bVar2 != 7) goto LAB_00158238;
      if ((long)(end + -(long)ptr) < 4) {
        return -2;
      }
      iVar4 = (*enc[3].scanners[1])(enc,ptr,end,(char **)(end + -(long)ptr));
      lVar7 = 4;
      pcVar6 = extraout_RDX;
    }
    if (iVar4 != 0) {
LAB_00158177:
      ptr_00 = (char **)(ptr + lVar7);
      uVar3 = uStack_38;
      do {
        if (ptr_00 == (char **)end) {
          return -1;
        }
        uStack_38._4_4_ = (int)((ulong)uVar3 >> 0x20);
        ppcVar5 = (char **)&DAT_00000001;
        uStack_38 = uVar3;
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ptr_00)) {
        case 5:
          if ((long)end - (long)ptr_00 < 2) {
            return -2;
          }
          iVar4 = (*enc[2].isPublicId)(enc,(char *)ptr_00,pcVar6,(char **)&DAT_00000001);
          ppcVar5 = (char **)0x2;
          pcVar6 = extraout_RDX_02;
          break;
        case 6:
          if ((long)end - (long)ptr_00 < 3) {
            return -2;
          }
          iVar4 = (*enc[2].utf8Convert)(enc,ptr_00,pcVar6,(char **)&DAT_00000001,(char *)in_R8);
          ppcVar5 = (char **)0x3;
          pcVar6 = extraout_RDX_04;
          break;
        case 7:
          if ((long)end - (long)ptr_00 < 4) {
            return -2;
          }
          iVar4 = (*enc[2].utf16Convert)(enc,ptr_00,pcVar6,(unsigned_short **)&DAT_00000001,in_R8);
          ppcVar5 = (char **)0x4;
          pcVar6 = extraout_RDX_03;
          break;
        default:
          ppcVar5 = ptr_00;
          goto LAB_0015833f;
        case 9:
        case 10:
        case 0x15:
          iVar4 = normal_checkPiTarget
                            ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),
                             (int *)&DAT_00000001);
          if (iVar4 == 0) goto switchD_001581b1_caseD_1d;
          ppcVar1 = (char **)((long)ptr_00 + 1);
          pcVar6 = extraout_RDX_05;
          uVar3 = uStack_38;
          goto joined_r0x0015826a;
        case 0xf:
          iVar4 = normal_checkPiTarget
                            ((ENCODING *)ptr,(char *)ptr_00,(char *)((long)&uStack_38 + 4),
                             (int *)&DAT_00000001);
          if (iVar4 == 0) goto switchD_001581b1_caseD_1d;
          ppcVar5 = (char **)((long)ptr_00 + 1);
          if (ppcVar5 == (char **)end) {
            return -1;
          }
          if (*(char *)ppcVar5 != '>') {
LAB_0015833f:
            *nextTokPtr = (char *)ppcVar5;
            return 0;
          }
          goto LAB_00158373;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_001581b1_caseD_16;
        case 0x1d:
          goto switchD_001581b1_caseD_1d;
        }
        uVar3 = uStack_38;
        if (iVar4 == 0) goto switchD_001581b1_caseD_1d;
switchD_001581b1_caseD_16:
        uStack_38 = uVar3;
        ptr_00 = (char **)((long)ptr_00 + (long)ppcVar5);
        uVar3 = uStack_38;
      } while( true );
    }
  }
  else {
    lVar7 = 1;
    pcVar6 = end;
    if ((bVar2 == 0x16) || (bVar2 == 0x18)) goto LAB_00158177;
  }
LAB_00158238:
  *nextTokPtr = ptr;
  return 0;
joined_r0x0015826a:
  ptr_00 = ppcVar1;
  if (ptr_00 == (char **)end) {
    return -1;
  }
  uStack_38._4_4_ = (int)((ulong)uVar3 >> 0x20);
  uStack_38 = uVar3;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ptr_00)) {
  case 0:
  case 1:
  case 8:
switchD_001581b1_caseD_1d:
    *nextTokPtr = (char *)ptr_00;
    return 0;
  default:
    ppcVar1 = (char **)((long)ptr_00 + 1);
    break;
  case 5:
    if ((long)end - (long)ptr_00 < 2) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[2])(enc,(char *)ptr_00,pcVar6,ppcVar5);
    if (iVar4 != 0) goto switchD_001581b1_caseD_1d;
    ppcVar1 = (char **)((long)ptr_00 + 2);
    pcVar6 = extraout_RDX_06;
    uVar3 = uStack_38;
    break;
  case 6:
    if ((long)end - (long)ptr_00 < 3) {
      return -2;
    }
    iVar4 = (*enc[3].scanners[3])(enc,(char *)ptr_00,pcVar6,ppcVar5);
    if (iVar4 != 0) goto switchD_001581b1_caseD_1d;
    ppcVar1 = (char **)((long)ptr_00 + 3);
    pcVar6 = extraout_RDX_07;
    uVar3 = uStack_38;
    break;
  case 7:
    if ((long)end - (long)ptr_00 < 4) {
      return -2;
    }
    iVar4 = (*enc[3].literalScanners[0])(enc,(char *)ptr_00,pcVar6,ppcVar5);
    if (iVar4 != 0) goto switchD_001581b1_caseD_1d;
    ppcVar1 = (char **)((long)ptr_00 + 4);
    pcVar6 = extraout_RDX_08;
    uVar3 = uStack_38;
    break;
  case 0xf:
    ppcVar1 = (char **)((long)ptr_00 + 1);
    if (ppcVar1 == (char **)end) {
      return -1;
    }
    if (*(byte *)ppcVar1 == 0x3e) {
LAB_00158373:
      *nextTokPtr = (char *)((long)ptr_00 + 2);
      return uStack_38._4_4_;
    }
  }
  goto joined_r0x0015826a;
}

Assistant:

static
int PREFIX(scanPi)(const ENCODING *enc, const char *ptr, const char *end,
                   const char **nextTokPtr)
{
  int tok;
  const char *target = ptr;
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_S: case BT_CR: case BT_LF:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      while (ptr != end) {
        switch (BYTE_TYPE(enc, ptr)) {
        INVALID_CASES(ptr, nextTokPtr)
        case BT_QUEST:
          ptr += MINBPC(enc);
          if (ptr == end)
            return XML_TOK_PARTIAL;
          if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
            *nextTokPtr = ptr + MINBPC(enc);
            return tok;
          }
          break;
        default:
          ptr += MINBPC(enc);
          break;
        }
      }
      return XML_TOK_PARTIAL;
    case BT_QUEST:
      if (!PREFIX(checkPiTarget)(enc, target, ptr, &tok)) {
        *nextTokPtr = ptr;
        return XML_TOK_INVALID;
      }
      ptr += MINBPC(enc);
      if (ptr == end)
        return XML_TOK_PARTIAL;
      if (CHAR_MATCHES(enc, ptr, ASCII_GT)) {
        *nextTokPtr = ptr + MINBPC(enc);
        return tok;
      }
      /* fall through */
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}